

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O0

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f *wo,Point2f *u)

{
  bool bVar1;
  Tuple3<pbrt::Vector3,_float> TVar2;
  long in_RSI;
  Tuple3<pbrt::Vector3,_float> *in_RDI;
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  Vector3f VVar8;
  bool flip;
  Vector3f wm;
  Point2f *in_stack_00000150;
  Float in_stack_00000158;
  Float in_stack_0000015c;
  Vector3f *in_stack_00000160;
  undefined8 local_c;
  float local_4;
  
  auVar6 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  bVar1 = *(float *)(in_RSI + 8) < 0.0;
  if (bVar1) {
    VVar7 = Tuple3<pbrt::Vector3,_float>::operator-(in_RDI);
    auVar3._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar3._8_56_ = auVar6;
    vmovlpd_avx(auVar3._0_16_);
  }
  auVar6 = (undefined1  [56])0x0;
  VVar8 = SampleTrowbridgeReitzVisibleArea
                    (in_stack_00000160,in_stack_0000015c,in_stack_00000158,in_stack_00000150);
  local_4 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_c = vmovlpd_avx(auVar4._0_16_);
  if (bVar1) {
    VVar7 = Tuple3<pbrt::Vector3,_float>::operator-(in_RDI);
    local_4 = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    local_c = vmovlpd_avx(auVar5._0_16_);
  }
  TVar2.z = local_4;
  TVar2.x = (float)(undefined4)local_c;
  TVar2.y = (float)local_c._4_4_;
  return (Vector3f)TVar2;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(const Vector3f &wo, const Point2f &u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        if (flip)
            wm = -wm;
        return wm;
    }